

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PropertyId,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::shiftUp(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PropertyId,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,size_t startIdx,size_t insertion_idx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Node *pNVar2;
  Node *pNVar3;
  long lVar4;
  size_type sVar5;
  uint8_t *puVar6;
  InfoType IVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long lVar9;
  
  pNVar2 = this->mKeyVals;
  pNVar3 = pNVar2 + startIdx;
  paVar1 = &pNVar2[startIdx].mData.first.field_2;
  (&paVar1->_M_allocated_capacity)[-2] = (size_type)paVar1;
  paVar8 = &pNVar2[startIdx - 1].mData.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar1->_M_allocated_capacity)[-7] == paVar8) {
    sVar5 = *(size_type *)((long)&pNVar2[startIdx - 1].mData.first.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar8->_M_allocated_capacity;
    (&paVar1->_M_allocated_capacity)[1] = sVar5;
  }
  else {
    (pNVar3->mData).first._M_dataplus._M_p = (pointer)(&paVar1->_M_allocated_capacity)[-7];
    (pNVar3->mData).first.field_2._M_allocated_capacity =
         pNVar3[-1].mData.first.field_2._M_allocated_capacity;
  }
  (pNVar3->mData).first._M_string_length = pNVar3[-1].mData.first._M_string_length;
  pNVar3[-1].mData.first._M_dataplus._M_p = (pointer)paVar8;
  pNVar3[-1].mData.first._M_string_length = 0;
  pNVar3[-1].mData.first.field_2._M_local_buf[0] = '\0';
  (pNVar3->mData).second = pNVar3[-1].mData.second;
  if (startIdx - 1 != insertion_idx) {
    lVar9 = (insertion_idx - startIdx) + 1;
    lVar4 = startIdx * 0x28;
    do {
      pNVar3 = this->mKeyVals;
      std::__cxx11::string::operator=
                ((string *)((long)&pNVar3[-1].mData.first._M_dataplus._M_p + lVar4),
                 (string *)((long)&pNVar3[-2].mData.first._M_dataplus._M_p + lVar4));
      (&pNVar3[-1].mData.second)[lVar4] = (&pNVar3[-2].mData.second)[lVar4];
      lVar9 = lVar9 + 1;
      lVar4 = lVar4 + -0x28;
    } while (lVar9 != 0);
  }
  if (startIdx != insertion_idx) {
    puVar6 = this->mInfo;
    IVar7 = this->mInfoInc;
    do {
      puVar6[startIdx] = (char)IVar7 + puVar6[startIdx - 1];
      puVar6 = this->mInfo;
      IVar7 = this->mInfoInc;
      if (0xff < puVar6[startIdx] + IVar7) {
        this->mMaxNumElementsAllowed = 0;
      }
      startIdx = startIdx - 1;
    } while (insertion_idx != startIdx);
  }
  return;
}

Assistant:

void
    shiftUp(size_t startIdx,
            size_t const insertion_idx) noexcept(std::is_nothrow_move_assignable<Node>::value) {
        auto idx = startIdx;
        ::new (static_cast<void*>(mKeyVals + idx)) Node(std::move(mKeyVals[idx - 1]));
        while (--idx != insertion_idx) {
            mKeyVals[idx] = std::move(mKeyVals[idx - 1]);
        }

        idx = startIdx;
        while (idx != insertion_idx) {
            ROBIN_HOOD_COUNT(shiftUp)
            mInfo[idx] = static_cast<uint8_t>(mInfo[idx - 1] + mInfoInc);
            if (ROBIN_HOOD_UNLIKELY(mInfo[idx] + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }
            --idx;
        }
    }